

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O1

void operator_delete__(void *p)

{
  if (base::internal::delete_hooks_ != 0) {
    tcmalloc::InvokeDeleteHookSlow(p);
  }
  DebugDeallocate(p,-0x4315208e,0);
  return;
}

Assistant:

PERFTOOLS_DLL_DECL void tc_deletearray(void* p) PERFTOOLS_NOTHROW {
  tcmalloc::InvokeDeleteHook(p);
  DebugDeallocate(p, MallocBlock::kArrayNewType, 0);
  force_frame();
}